

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsize.cpp
# Opt level: O1

QSize __thiscall QSize::scaled(QSize *this,QSize *s,AspectRatioMode mode)

{
  bool bVar1;
  QSize QVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  
  if (((mode == IgnoreAspectRatio) || (lVar6 = (long)(this->wd).m_i, lVar6 == 0)) ||
     (lVar5 = (long)(this->ht).m_i, lVar5 == 0)) {
    QVar2 = *s;
    uVar4 = (ulong)QVar2 >> 0x20;
  }
  else {
    uVar4 = (ulong)(s->ht).m_i;
    QVar2 = (QSize)((long)(uVar4 * lVar6) / lVar5);
    lVar3 = (long)(s->wd).m_i;
    bVar1 = lVar3 <= (long)QVar2;
    if (mode == KeepAspectRatio) {
      bVar1 = (long)QVar2 <= lVar3;
    }
    if (!bVar1) {
      QVar2 = (QSize)(long)(s->wd).m_i;
      uVar4 = (lVar5 * (long)QVar2) / lVar6;
    }
  }
  return (QSize)((ulong)QVar2 & 0xffffffff | uVar4 << 0x20);
}

Assistant:

QSize QSize::scaled(const QSize &s, Qt::AspectRatioMode mode) const noexcept
{
    if (mode == Qt::IgnoreAspectRatio || wd == 0 || ht == 0) {
        return s;
    } else {
        bool useHeight;
        qint64 rw = qint64(s.height()) * qint64(width()) / qint64(height());

        if (mode == Qt::KeepAspectRatio) {
            useHeight = (rw <= s.width());
        } else { // mode == Qt::KeepAspectRatioByExpanding
            useHeight = (rw >= s.width());
        }

        if (useHeight) {
            return QSize(int(rw), s.height());
        } else {
            return QSize(s.width(),
                         qint32(qint64(s.width()) * qint64(height()) / qint64(width())));
        }
    }
}